

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_return_new_handle(UnixSftpServer *uss,SftpReplyBuilder *reply,int fd)

{
  uint uVar1;
  uint *puVar2;
  _Bool *p_Var3;
  ulong local_28;
  size_t old_size;
  int fd_local;
  SftpReplyBuilder *reply_local;
  UnixSftpServer *uss_local;
  
  if (fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sftpserver.c"
                  ,0x77,"void uss_return_new_handle(UnixSftpServer *, SftpReplyBuilder *, int)");
  }
  if (uss->fdsize <= (ulong)(long)fd) {
    local_28 = uss->fdsize;
    puVar2 = (uint *)safegrowarray(uss->fdseqs,&uss->fdsize,4,(long)fd,1,false);
    uss->fdseqs = puVar2;
    p_Var3 = (_Bool *)saferealloc(uss->fdsopen,uss->fdsize,1);
    uss->fdsopen = p_Var3;
    for (; local_28 < uss->fdsize; local_28 = local_28 + 1) {
      uss->fdseqs[local_28] = 0;
      uss->fdsopen[local_28] = false;
    }
  }
  if ((uss->fdsopen[fd] & 1U) != 0) {
    __assert_fail("!uss->fdsopen[fd]",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sftpserver.c"
                  ,0x82,"void uss_return_new_handle(UnixSftpServer *, SftpReplyBuilder *, int)");
  }
  uss->fdsopen[fd] = true;
  uVar1 = uss->fdseqs[fd] + 1;
  uss->fdseqs[fd] = uVar1;
  if (uVar1 == 0xffffffff) {
    uss->fdseqs[fd] = 0;
  }
  uss_return_handle_raw(uss,reply,fd,uss->fdseqs[fd]);
  return;
}

Assistant:

static void uss_return_new_handle(
    UnixSftpServer *uss, SftpReplyBuilder *reply, int fd)
{
    assert(fd >= 0);
    if (fd >= uss->fdsize) {
        size_t old_size = uss->fdsize;
        sgrowarray(uss->fdseqs, uss->fdsize, fd);
        uss->fdsopen = sresize(uss->fdsopen, uss->fdsize, bool);
        while (old_size < uss->fdsize) {
            uss->fdseqs[old_size] = 0;
            uss->fdsopen[old_size] = false;
            old_size++;
        }
    }
    assert(!uss->fdsopen[fd]);
    uss->fdsopen[fd] = true;
    if (++uss->fdseqs[fd] == USS_DIRHANDLE_SEQ)
        uss->fdseqs[fd] = 0;
    uss_return_handle_raw(uss, reply, fd, uss->fdseqs[fd]);
}